

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJIO.cpp
# Opt level: O0

int main(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Am_Object *pAVar6;
  Am_Value *pAVar7;
  Am_Wrapper *pAVar8;
  Am_Method_Wrapper *pAVar9;
  ostream *poVar10;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object cmd;
  Am_Object local_108;
  Am_Object how_set_inter;
  Am_Object local_f8;
  Am_Font local_f0 [8];
  Am_Object local_e8;
  Am_Font local_e0 [8];
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object qbutton;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object instructions3;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object instructions2;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object instructions1;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object title;
  Am_Object local_18;
  int local_c;
  
  local_c = 0;
  Am_Initialize();
  Am_Object::Create((char *)&local_18);
  uVar2 = Am_Object::Set((ushort)&local_18,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  uVar2 = Am_Object::Set(uVar2,0x66,0x2ee);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,0x67,500);
  Am_Object::operator=(&mywin,pAVar6);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Am_Object(&title,(Am_Object *)&mywin);
  Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(&title,0),1);
  Am_Object::~Am_Object(&title);
  Am_Object::Create((char *)&local_40);
  uVar2 = Am_Object::Set((ushort)&local_40,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x10d676);
  Am_Object::Am_Object(&local_38,pAVar6);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&instructions1,(Am_Object *)&local_38);
  Am_Object::Add_Part((Am_Object *)&mywin,SUB81(&instructions1,0),1);
  Am_Object::~Am_Object(&instructions1);
  Am_Object::Create((char *)&local_58);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_38,0x65);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&local_58,0x65,(ulong)uVar3);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_38,100);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_38,0x66);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)(uint)(iVar4 + 10 + iVar5));
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x10d69f);
  Am_Object::Am_Object(&local_50,pAVar6);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Am_Object(&instructions2,(Am_Object *)&local_50);
  Am_Object::Add_Part((Am_Object *)&mywin,SUB81(&instructions2,0),1);
  Am_Object::~Am_Object(&instructions2);
  Am_Object::Create((char *)&local_70);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_38,0x65);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_38,0x67);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&local_70,0x65,(ulong)(uint)(iVar4 + 2 + iVar5));
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_50,100);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)uVar3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x10d6eb);
  Am_Object::Am_Object(&local_68,pAVar6);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Am_Object(&instructions3,(Am_Object *)&local_68);
  Am_Object::Add_Part((Am_Object *)&mywin,SUB81(&instructions3,0),1);
  Am_Object::~Am_Object(&instructions3);
  Am_Object::Create((char *)&local_88);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_68,0x65);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_68,0x67);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&local_88,0x65,(ulong)(uint)(iVar4 + 2 + iVar5));
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_50,100);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)uVar3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x10d730);
  Am_Object::Am_Object(&local_80,pAVar6);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Am_Object(&qbutton,(Am_Object *)&local_80);
  Am_Object::Add_Part((Am_Object *)&mywin,SUB81(&qbutton,0),1);
  Am_Object::~Am_Object(&qbutton);
  Am_Object::Create((char *)&local_a0);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_38,0x65);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&local_a0,0x65,(ulong)uVar3);
  pAVar8 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&JTM_Font);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar8);
  Am_Object::Am_Object(&local_98,pAVar6);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Get_Object((ushort)&local_a8,(ulong)&local_98);
  uVar2 = Am_Object::Set((ushort)&local_a8,(char *)0x150,0x10d76d);
  pAVar9 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&qmethod);
  Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xca,(ulong)pAVar9);
  Am_Object::~Am_Object(&local_a8);
  pAVar7 = (Am_Value *)Am_Object::Get(0x1358,0x66);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_98,0x66);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  Am_Object::Set((ushort)&local_98,100,(ulong)((iVar4 - iVar5) - 10));
  Am_Object::Am_Object(&local_b0,(Am_Object *)&local_98);
  Am_Object::Add_Part((Am_Object *)&mywin,SUB81(&local_b0,0),1);
  Am_Object::~Am_Object(&local_b0);
  Test_Group_Init();
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing Size Face Group\n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  Size_Face_Init((char *)&local_b8,"\x1b$B4A;z%U%)%s%H%F%9%H\x1b(B",
                 "\x1b$B$3$l$O4A;z%F%-%9%H$NNc$G$9!#\x1b(B");
  Am_Object::operator=(&Size_Face_Group,(Am_Object *)&local_b8);
  Am_Object::~Am_Object(&local_b8);
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing Size Face (EUC) Group\n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  Size_Face_Init((char *)&local_c0,anon_var_dwarf_239e,anon_var_dwarf_23b6);
  Am_Object::operator=(&Size_Face_EUC_Group,(Am_Object *)&local_c0);
  Am_Object::~Am_Object(&local_c0);
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing More Sizes Group\n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  More_Sizes_Init();
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing Families Group\n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  Families_Init();
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing Edit Group\n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  Edit_Init((char *)&local_c8,"\x1b$B4A;zF~NO%F%9%H\x1b(B");
  Am_Object::operator=(&Edit_Group,(Am_Object *)&local_c8);
  Am_Object::~Am_Object(&local_c8);
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing Edit Group (EUC) \n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  Edit_Init((char *)&local_d0,anon_var_dwarf_243a);
  Am_Object::operator=(&Edit_EUC_Group,(Am_Object *)&local_d0);
  Am_Object::~Am_Object(&local_d0);
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing Ktable Group\n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  Am_Font::Am_Font(local_e0,(Am_Font *)&JTL_Font);
  Ktable_Init((Am_Font *)&local_d8,(char *)local_e0,"\x1b$B4A;z%3!<%II=\x1b(B",
              "Japanese Kanji Code Table");
  Am_Object::operator=(&Ktable_Group,(Am_Object *)&local_d8);
  Am_Object::~Am_Object(&local_d8);
  Am_Font::~Am_Font(local_e0);
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing Kktable Group\n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  Am_Font::Am_Font(local_f0,(Am_Font *)&KTL_Font);
  Ktable_Init((Am_Font *)&local_e8,(char *)local_f0,"\x1b$B4A;z%3!<%II=\x1b(B","Korean Code Table");
  Am_Object::operator=(&Kktable_Group,(Am_Object *)&local_e8);
  Am_Object::~Am_Object(&local_e8);
  Am_Font::~Am_Font(local_f0);
  poVar10 = std::operator<<((ostream *)&std::cout,"Initializing Kctable Group\n");
  std::ostream::operator<<((ostream *)poVar10,std::flush<char,std::char_traits<char>>);
  Am_Font::Am_Font((Am_Font *)&how_set_inter,(Am_Font *)&CTL_Font);
  Ktable_Init((Am_Font *)&local_f8,(char *)&how_set_inter,"\x1b$B4A;z%3!<%II=\x1b(B",
              "Chinese Code Table");
  Am_Object::operator=(&Kctable_Group,(Am_Object *)&local_f8);
  Am_Object::~Am_Object(&local_f8);
  Am_Font::~Am_Font((Am_Font *)&how_set_inter);
  Am_Object::Create((char *)&cmd);
  uVar2 = Am_Object::Set((ushort)&cmd,(char *)0xb9,0x10d9af);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,true,1);
  Am_Object::Am_Object(&local_108,pAVar6);
  Am_Object::~Am_Object(&cmd);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_108,0xc5);
  Am_Object::Am_Object(&local_118,pAVar7);
  pAVar9 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&change_setting);
  Am_Object::Set((ushort)&local_118,(Am_Method_Wrapper *)0xca,(ulong)pAVar9);
  Am_Object::Am_Object(&local_120,(Am_Object *)&local_108);
  Am_Object::Add_Part((Am_Object *)&mywin,SUB81(&local_120,0),1);
  Am_Object::~Am_Object(&local_120);
  AVar1 = DISPLAY_PART;
  Am_Object::Am_Object(&local_128,(Am_Object *)&Test_Group);
  Am_Object::Add_Part(0x1358,(Am_Object *)(ulong)AVar1,(ulong)&local_128);
  Am_Object::~Am_Object(&local_128);
  Am_Main_Event_Loop();
  Am_Cleanup();
  local_c = 0;
  Am_Object::~Am_Object(&local_118);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_38);
  return local_c;
}

Assistant:

int
main()
{
  Am_Initialize();

  mywin = Am_Window.Create("mywin")
              .Set(Am_LEFT, 20)
              .Set(Am_TOP, 20)
              .Set(Am_WIDTH, 750)
              .Set(Am_HEIGHT, 500);
  Am_Screen.Add_Part(mywin);

  Am_Object title = Am_Text.Create("title")
                        .Set(Am_LEFT, 10)
                        .Set(Am_TOP, 10)
                        .Set(Am_TEXT, "Japanese I/O Test  Type:  ");
  mywin.Add_Part(title);

  Am_Object instructions1 =
      Am_Text.Create("instructions1")
          .Set(Am_TOP, (int)title.Get(Am_TOP))
          .Set(Am_LEFT, (int)title.Get(Am_LEFT) + (int)title.Get(Am_WIDTH) + 10)
          .Set(Am_TEXT,
               "1 for Size Face, 2 for More Sizes, 3 for Families, 4 for Edit");
  mywin.Add_Part(instructions1);

  Am_Object instructions2 =
      Am_Text.Create("instructions2")
          .Set(Am_TOP, (int)title.Get(Am_TOP) + (int)title.Get(Am_HEIGHT) + 2)
          .Set(Am_LEFT, (int)instructions1.Get(Am_LEFT))
          .Set(Am_TEXT, "5 for Size Face (EUC), 6 for Edit (EUC), 7 for "
                        "Ktable, 8 for Kktable");
  mywin.Add_Part(instructions2);

  Am_Object instructions3 =
      Am_Text.Create("instructions2")
          .Set(Am_TOP, (int)instructions2.Get(Am_TOP) +
                           (int)instructions2.Get(Am_HEIGHT) + 2)
          .Set(Am_LEFT, (int)instructions1.Get(Am_LEFT))
          .Set(Am_TEXT, "9 for Kctable, 0 for Nothing, q (or button) for Quit");
  mywin.Add_Part(instructions3);

  Am_Object qbutton = Am_Button.Create("qbutton")
                          .Set(Am_TOP, (int)title.Get(Am_TOP))
                          .Set(Am_FONT, QBUTTON_FONT);
  qbutton.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, QBUTTON_STRING)
      .Set(Am_DO_METHOD, qmethod);
  qbutton.Set(Am_LEFT,
              (int)mywin.Get(Am_WIDTH) - (int)qbutton.Get(Am_WIDTH) - 10);
  mywin.Add_Part(qbutton);

  Test_Group_Init();
  cout << "Initializing Size Face Group\n" << flush;
  Size_Face_Group = Size_Face_Init(KANJI, TEST_STRING, "Size Face");
  cout << "Initializing Size Face (EUC) Group\n" << flush;
  Size_Face_EUC_Group =
      Size_Face_Init(EUC_KANJI, EUC_TEST_STRING, "Size Face EUC");
  cout << "Initializing More Sizes Group\n" << flush;
  More_Sizes_Init();
  cout << "Initializing Families Group\n" << flush;
  Families_Init();
  cout << "Initializing Edit Group\n" << flush;
  Edit_Group = Edit_Init(KANJIE, PTEXT_STRING);
  cout << "Initializing Edit Group (EUC) \n" << flush;
  Edit_EUC_Group = Edit_Init(EUC_KANJIE, EUC_PTEXT_STRING);
  cout << "Initializing Ktable Group\n" << flush;
  Ktable_Group =
      Ktable_Init(KLINE_FONT, KTITLE, "Japanese Kanji Code Table", "Ktable");
  cout << "Initializing Kktable Group\n" << flush;
  Kktable_Group =
      Ktable_Init(KKLINE_FONT, KKTITLE, "Korean Code Table", "Kktable");
  cout << "Initializing Kctable Group\n" << flush;
  Kctable_Group =
      Ktable_Init(KCLINE_FONT, KCTITLE, "Chinese Code Table", "Kctable");

  Am_Object how_set_inter = Am_One_Shot_Interactor.Create("change_settings")
                                .Set(Am_START_WHEN, "ANY_KEYBOARD")
                                .Set(Am_START_WHERE_TEST, true);

  Am_Object cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  mywin.Add_Part(how_set_inter);

  mywin.Add_Part(DISPLAY_PART, Test_Group);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}